

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_normal_attribute_decoder.cc
# Opt level: O1

bool __thiscall
draco::SequentialNormalAttributeDecoder::Init
          (SequentialNormalAttributeDecoder *this,PointCloudDecoder *decoder,int attribute_id)

{
  PointAttribute *pPVar1;
  bool bVar2;
  
  bVar2 = SequentialIntegerAttributeDecoder::Init
                    (&this->super_SequentialIntegerAttributeDecoder,decoder,attribute_id);
  if ((bVar2) &&
     (pPVar1 = (this->super_SequentialIntegerAttributeDecoder).super_SequentialAttributeDecoder.
               attribute_, (pPVar1->super_GeometryAttribute).num_components_ == '\x03')) {
    bVar2 = (pPVar1->super_GeometryAttribute).data_type_ == DT_FLOAT32;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool SequentialNormalAttributeDecoder::Init(PointCloudDecoder *decoder,
                                            int attribute_id) {
  if (!SequentialIntegerAttributeDecoder::Init(decoder, attribute_id)) {
    return false;
  }
  // Currently, this encoder works only for 3-component normal vectors.
  if (attribute()->num_components() != 3) {
    return false;
  }
  // Also the data type must be DT_FLOAT32.
  if (attribute()->data_type() != DT_FLOAT32) {
    return false;
  }
  return true;
}